

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O0

bool __thiscall Assimp::XGLImporter::ReadElementUpToClosing(XGLImporter *this,char *closetag)

{
  char *__s;
  uint uVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  allocator<char> local_1f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  format local_198;
  char *local_20;
  char *closetag_local;
  XGLImporter *this_local;
  
  local_20 = closetag;
  closetag_local = (char *)this;
  while( true ) {
    peVar3 = std::
             __shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_reader);
    uVar1 = (*peVar3->_vptr_IIrrXMLReader[2])();
    __s = local_20;
    if ((uVar1 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,__s,&local_1f9);
      std::operator+(&local_1d8,"unexpected EOF, expected closing <",&local_1f8);
      std::operator+(&local_1b8,&local_1d8,"> tag");
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
      basic_formatter<std::__cxx11::string>
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_198,
                 &local_1b8);
      LogFunctions<Assimp::XGLImporter>::LogError(&local_198);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_198);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::allocator<char>::~allocator(&local_1f9);
      return false;
    }
    peVar3 = std::
             __shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_reader);
    iVar2 = (*peVar3->_vptr_IIrrXMLReader[3])();
    if (iVar2 == 1) break;
    peVar3 = std::
             __shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_reader);
    iVar2 = (*peVar3->_vptr_IIrrXMLReader[3])();
    if (iVar2 == 2) {
      peVar3 = std::
               __shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_reader);
      iVar2 = (*peVar3->_vptr_IIrrXMLReader[0xd])();
      iVar2 = ASSIMP_stricmp((char *)CONCAT44(extraout_var,iVar2),local_20);
      if (iVar2 == 0) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool XGLImporter::ReadElementUpToClosing(const char* closetag)
{
    while(m_reader->read()) {
        if (m_reader->getNodeType() == EXN_ELEMENT) {
            return true;
        }
        else if (m_reader->getNodeType() == EXN_ELEMENT_END && !ASSIMP_stricmp(m_reader->getNodeName(),closetag)) {
            return false;
        }
    }
    LogError("unexpected EOF, expected closing <" + std::string(closetag) + "> tag");
    return false;
}